

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall Assimp::MDLImporter::InternReadFile_Quake1(MDLImporter *this)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  DeadlyImportError *this_00;
  uint *puVar7;
  aiMesh *this_01;
  ulong uVar8;
  ulong uVar9;
  aiVector3D *paVar10;
  ulong *puVar11;
  aiNode *this_02;
  uint *puVar12;
  aiMesh **ppaVar13;
  Logger *this_03;
  aiFace *paVar14;
  ulong uVar15;
  aiVector3t<float> *local_180;
  aiFace *local_158;
  aiVector3t<float> *local_130;
  aiVector3t<float> *local_108;
  float local_cc;
  float t;
  float s;
  aiVector3D *vec;
  uint local_b8;
  uint iIndex;
  uint c;
  uint iTemp;
  uint i_1;
  uint iCurrent;
  aiMesh *pcMesh;
  Vertex *pcVertices;
  GroupFrame *pcFrames2;
  SimpleFrame *pcFirstFrame;
  Frame *pcFrames;
  Triangle *pcTriangles;
  TexCoord *pcTexCoords;
  uint iSkip;
  uint iNumImages;
  allocator local_51;
  string local_50;
  uint *local_30;
  Skin *pcSkin;
  Vertex *pVStack_20;
  uint i;
  uchar *szCurrent;
  Header *pcHeader;
  MDLImporter *this_local;
  
  pcHeader = (Header *)this;
  if (this->pScene == (aiScene *)0x0) {
    __assert_fail("__null != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                  ,0x159,"void Assimp::MDLImporter::InternReadFile_Quake1()");
  }
  szCurrent = this->mBuffer;
  ValidateHeader_Quake1(this,(Header *)szCurrent);
  pVStack_20 = (Vertex *)(szCurrent + 0x54);
  pcSkin._4_4_ = 0;
  while( true ) {
    puVar7 = (uint *)pVStack_20;
    if (*(uint *)(szCurrent + 0x30) <= pcSkin._4_4_) {
      pcFrames = (Frame *)((uint *)pVStack_20 + (long)*(int *)(szCurrent + 0x3c) * 3);
      pVStack_20 = &(pcFrames->frame).bboxmin + (long)*(int *)(szCurrent + 0x40) * 4 + -1;
      SizeCheck(this,pVStack_20,
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                ,0x192);
      if (*pVStack_20 == (Vertex)0x0) {
        pcFrames2 = (GroupFrame *)(pVStack_20 + 1);
      }
      else {
        pcFrames2 = *(GroupFrame **)(pVStack_20 + 5);
      }
      SizeCheck(this,&pcFrames2->max + (long)*(int *)(szCurrent + 0x3c) + 4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                ,0x1a1);
      SetupMaterialProperties_3DGS_MDL5_Quake1(this);
      this_01 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(this_01);
      this_01->mPrimitiveTypes = 4;
      this_01->mNumVertices = *(int *)(szCurrent + 0x40) * 3;
      this_01->mNumFaces = *(uint *)(szCurrent + 0x40);
      uVar8 = CONCAT44(0,this_01->mNumVertices);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar8;
      uVar9 = SUB168(auVar3 * ZEXT816(0xc),0);
      if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
        uVar9 = 0xffffffffffffffff;
      }
      paVar10 = (aiVector3D *)operator_new__(uVar9);
      if (uVar8 != 0) {
        local_108 = paVar10;
        do {
          aiVector3t<float>::aiVector3t(local_108);
          local_108 = local_108 + 1;
        } while (local_108 != paVar10 + uVar8);
      }
      this_01->mVertices = paVar10;
      uVar8 = CONCAT44(0,this_01->mNumVertices);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar8;
      uVar9 = SUB168(auVar4 * ZEXT816(0xc),0);
      if (SUB168(auVar4 * ZEXT816(0xc),8) != 0) {
        uVar9 = 0xffffffffffffffff;
      }
      paVar10 = (aiVector3D *)operator_new__(uVar9);
      if (uVar8 != 0) {
        local_130 = paVar10;
        do {
          aiVector3t<float>::aiVector3t(local_130);
          local_130 = local_130 + 1;
        } while (local_130 != paVar10 + uVar8);
      }
      this_01->mTextureCoords[0] = paVar10;
      uVar8 = CONCAT44(0,this_01->mNumFaces);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar8;
      uVar9 = SUB168(auVar5 * ZEXT816(0x10),0);
      uVar15 = uVar9 + 8;
      if (SUB168(auVar5 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar9) {
        uVar15 = 0xffffffffffffffff;
      }
      puVar11 = (ulong *)operator_new__(uVar15);
      *puVar11 = uVar8;
      paVar14 = (aiFace *)(puVar11 + 1);
      if (uVar8 != 0) {
        local_158 = paVar14;
        do {
          aiFace::aiFace(local_158);
          local_158 = local_158 + 1;
        } while (local_158 != paVar14 + uVar8);
      }
      this_01->mFaces = paVar14;
      uVar8 = CONCAT44(0,this_01->mNumVertices);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar8;
      uVar9 = SUB168(auVar6 * ZEXT816(0xc),0);
      if (SUB168(auVar6 * ZEXT816(0xc),8) != 0) {
        uVar9 = 0xffffffffffffffff;
      }
      paVar10 = (aiVector3D *)operator_new__(uVar9);
      if (uVar8 != 0) {
        local_180 = paVar10;
        do {
          aiVector3t<float>::aiVector3t(local_180);
          local_180 = local_180 + 1;
        } while (local_180 != paVar10 + uVar8);
      }
      this_01->mNormals = paVar10;
      this_01->mNumUVComponents[0] = 2;
      this_02 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_02);
      this->pScene->mRootNode = this_02;
      this->pScene->mRootNode->mNumMeshes = 1;
      puVar12 = (uint *)operator_new__(4);
      this->pScene->mRootNode->mMeshes = puVar12;
      *this->pScene->mRootNode->mMeshes = 0;
      this->pScene->mNumMeshes = 1;
      ppaVar13 = (aiMesh **)operator_new__(8);
      this->pScene->mMeshes = ppaVar13;
      *this->pScene->mMeshes = this_01;
      iTemp = 0;
      for (c = 0; uVar1 = iTemp, c < *(uint *)(szCurrent + 0x40); c = c + 1) {
        puVar12 = (uint *)operator_new__(0xc);
        this_01->mFaces[c].mIndices = puVar12;
        this_01->mFaces[c].mNumIndices = 3;
        for (local_b8 = 0; local_b8 < 3; local_b8 = local_b8 + 1) {
          this_01->mFaces[c].mIndices[local_b8] = iTemp;
          vec._4_4_ = (&(pcFrames->frame).bboxmin)[local_b8];
          if ((uint)*(Vertex *)(szCurrent + 0x3c) <= (uint)vec._4_4_) {
            vec._4_4_ = (Vertex)(*(int *)(szCurrent + 0x3c) - 1);
            this_03 = DefaultLogger::get();
            Logger::warn(this_03,"Index overflow in Q1-MDL vertex list.");
          }
          paVar10 = this_01->mVertices + iTemp;
          paVar10->x = (float)(&pcFrames2->max)[(ulong)(uint)vec._4_4_ + 4].v[0] *
                       *(float *)(szCurrent + 8);
          paVar10->x = paVar10->x + *(float *)(szCurrent + 0x14);
          paVar10->y = (float)(&pcFrames2->max)[(ulong)(uint)vec._4_4_ + 4].v[1] *
                       *(float *)(szCurrent + 0xc);
          paVar10->y = paVar10->y + *(float *)(szCurrent + 0x18);
          paVar10->z = (float)(&pcFrames2->max)[(ulong)(uint)vec._4_4_ + 4].v[2] *
                       *(float *)(szCurrent + 0x10);
          paVar10->z = *(float *)(szCurrent + 0x1c) + paVar10->z;
          MD2::LookupNormalIndex
                    ((&pcFrames2->max)[(ulong)(uint)vec._4_4_ + 4].normalIndex,
                     this_01->mNormals + iTemp);
          local_cc = (float)(int)puVar7[(ulong)(uint)vec._4_4_ * 3 + 1];
          uVar2 = puVar7[(ulong)(uint)vec._4_4_ * 3 + 2];
          if ((pcFrames->type == 0) && (puVar7[(ulong)(uint)vec._4_4_ * 3] != 0)) {
            local_cc = (float)*(int *)(szCurrent + 0x34) * 0.5 + local_cc;
          }
          this_01->mTextureCoords[0][iTemp].x = (local_cc + 0.5) / (float)*(int *)(szCurrent + 0x34)
          ;
          this_01->mTextureCoords[0][iTemp].y =
               1.0 - ((float)(int)uVar2 + 0.5) / (float)*(int *)(szCurrent + 0x38);
          iTemp = iTemp + 1;
        }
        *this_01->mFaces[c].mIndices = uVar1 + 2;
        this_01->mFaces[c].mIndices[1] = uVar1 + 1;
        this_01->mFaces[c].mIndices[2] = uVar1;
        pcFrames = (Frame *)((pcFrames->frame).name + 4);
      }
      return;
    }
    if (this->mBuffer + this->iFileSize < (uint *)pVStack_20 + 3) break;
    local_30 = (uint *)pVStack_20;
    if (*(uint *)pVStack_20 == 1) {
      pcTexCoords._4_4_ = ((uint *)pVStack_20)[1];
      pVStack_20 = (Vertex *)((uint *)pVStack_20 + 2);
      if (pcTexCoords._4_4_ != 0) {
        if (pcSkin._4_4_ == 0) {
          CreateTextureARGB8_3DGS_MDL3(this,(uchar *)((uint *)pVStack_20 + pcTexCoords._4_4_));
        }
        pVStack_20 = (Vertex *)
                     ((long)(*(int *)(szCurrent + 0x38) * *(int *)(szCurrent + 0x34)) +
                      (ulong)pcTexCoords._4_4_ * 4 + (long)pVStack_20);
      }
    }
    else {
      puVar7 = (uint *)pVStack_20 + 1;
      pcTexCoords._0_4_ = 0;
      if (pcSkin._4_4_ != 0) {
        pcTexCoords._0_4_ = 0xffffffff;
      }
      uVar1 = *(uint *)pVStack_20;
      pVStack_20 = (Vertex *)puVar7;
      CreateTexture_3DGS_MDL4(this,(uchar *)puVar7,uVar1,(uint *)&pcTexCoords);
      pVStack_20 = (Vertex *)((long)pVStack_20 + (ulong)(uint)pcTexCoords);
    }
    pcSkin._4_4_ = pcSkin._4_4_ + 1;
  }
  iSkip._3_1_ = 1;
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"[Quake 1 MDL] Unexpected EOF",&local_51);
  DeadlyImportError::DeadlyImportError(this_00,&local_50);
  iSkip._3_1_ = 0;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void MDLImporter::InternReadFile_Quake1() {
    ai_assert(NULL != pScene);

    BE_NCONST MDL::Header *pcHeader = (BE_NCONST MDL::Header*)this->mBuffer;

#ifdef AI_BUILD_BIG_ENDIAN
    FlipQuakeHeader(pcHeader);
#endif

    ValidateHeader_Quake1(pcHeader);

    // current cursor position in the file
    const unsigned char* szCurrent = (const unsigned char*)(pcHeader+1);

    // need to read all textures
    for ( unsigned int i = 0; i < (unsigned int)pcHeader->num_skins; ++i) {
        union {
            BE_NCONST MDL::Skin* pcSkin;
            BE_NCONST MDL::GroupSkin* pcGroupSkin;
        };
        if (szCurrent + sizeof(MDL::Skin) > this->mBuffer + this->iFileSize) {
            throw DeadlyImportError("[Quake 1 MDL] Unexpected EOF");
        }
        pcSkin = (BE_NCONST MDL::Skin*)szCurrent;

        AI_SWAP4( pcSkin->group );

        // Quake 1 group-skins
        if (1 == pcSkin->group) {
            AI_SWAP4( pcGroupSkin->nb );

            // need to skip multiple images
            const unsigned int iNumImages = (unsigned int)pcGroupSkin->nb;
            szCurrent += sizeof(uint32_t) * 2;

            if (0 != iNumImages) {
                if (!i) {
                    // however, create only one output image (the first)
                    this->CreateTextureARGB8_3DGS_MDL3(szCurrent + iNumImages * sizeof(float));
                }
                // go to the end of the skin section / the beginning of the next skin
                szCurrent += pcHeader->skinheight * pcHeader->skinwidth +
                    sizeof(float) * iNumImages;
            }
        } else {
            szCurrent += sizeof(uint32_t);
            unsigned int iSkip = i ? UINT_MAX : 0;
            CreateTexture_3DGS_MDL4(szCurrent,pcSkin->group,&iSkip);
            szCurrent += iSkip;
        }
    }
    // get a pointer to the texture coordinates
    BE_NCONST MDL::TexCoord* pcTexCoords = (BE_NCONST MDL::TexCoord*)szCurrent;
    szCurrent += sizeof(MDL::TexCoord) * pcHeader->num_verts;

    // get a pointer to the triangles
    BE_NCONST MDL::Triangle* pcTriangles = (BE_NCONST MDL::Triangle*)szCurrent;
    szCurrent += sizeof(MDL::Triangle) * pcHeader->num_tris;
    VALIDATE_FILE_SIZE(szCurrent);

    // now get a pointer to the first frame in the file
    BE_NCONST MDL::Frame* pcFrames = (BE_NCONST MDL::Frame*)szCurrent;
    MDL::SimpleFrame* pcFirstFrame;

    if (0 == pcFrames->type) {
        // get address of single frame
        pcFirstFrame =( MDL::SimpleFrame*) &pcFrames->frame;
    } else {
        // get the first frame in the group
        BE_NCONST MDL::GroupFrame* pcFrames2 = (BE_NCONST MDL::GroupFrame*) pcFrames;
        pcFirstFrame = &(pcFrames2->frames[0]);
    }
    BE_NCONST MDL::Vertex* pcVertices = (BE_NCONST MDL::Vertex*) ((pcFirstFrame->name) + sizeof(pcFirstFrame->name));
    VALIDATE_FILE_SIZE((const unsigned char*)(pcVertices + pcHeader->num_verts));

#ifdef AI_BUILD_BIG_ENDIAN
    for (int i = 0; i<pcHeader->num_verts;++i)
    {
        AI_SWAP4( pcTexCoords[i].onseam );
        AI_SWAP4( pcTexCoords[i].s );
        AI_SWAP4( pcTexCoords[i].t );
    }

    for (int i = 0; i<pcHeader->num_tris;++i)
    {
        AI_SWAP4( pcTriangles[i].facesfront);
        AI_SWAP4( pcTriangles[i].vertex[0]);
        AI_SWAP4( pcTriangles[i].vertex[1]);
        AI_SWAP4( pcTriangles[i].vertex[2]);
    }
#endif

    // setup materials
    SetupMaterialProperties_3DGS_MDL5_Quake1();

    // allocate enough storage to hold all vertices and triangles
    aiMesh* pcMesh = new aiMesh();

    pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
    pcMesh->mNumVertices = pcHeader->num_tris * 3;
    pcMesh->mNumFaces = pcHeader->num_tris;
    pcMesh->mVertices = new aiVector3D[pcMesh->mNumVertices];
    pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
    pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];
    pcMesh->mNormals = new aiVector3D[pcMesh->mNumVertices];
    pcMesh->mNumUVComponents[0] = 2;

    // there won't be more than one mesh inside the file
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mNumMeshes = 1;
    pScene->mRootNode->mMeshes = new unsigned int[1];
    pScene->mRootNode->mMeshes[0] = 0;
    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[1];
    pScene->mMeshes[0] = pcMesh;

    // now iterate through all triangles
    unsigned int iCurrent = 0;
    for (unsigned int i = 0; i < (unsigned int) pcHeader->num_tris;++i)
    {
        pcMesh->mFaces[i].mIndices = new unsigned int[3];
        pcMesh->mFaces[i].mNumIndices = 3;

        unsigned int iTemp = iCurrent;
        for (unsigned int c = 0; c < 3;++c,++iCurrent)
        {
            pcMesh->mFaces[i].mIndices[c] = iCurrent;

            // read vertices
            unsigned int iIndex = pcTriangles->vertex[c];
            if (iIndex >= (unsigned int)pcHeader->num_verts)
            {
                iIndex = pcHeader->num_verts-1;
                ASSIMP_LOG_WARN("Index overflow in Q1-MDL vertex list.");
            }

            aiVector3D& vec = pcMesh->mVertices[iCurrent];
            vec.x = (float)pcVertices[iIndex].v[0] * pcHeader->scale[0];
            vec.x += pcHeader->translate[0];

            vec.y = (float)pcVertices[iIndex].v[1] * pcHeader->scale[1];
            vec.y += pcHeader->translate[1];
            //vec.y *= -1.0f;

            vec.z = (float)pcVertices[iIndex].v[2] * pcHeader->scale[2];
            vec.z += pcHeader->translate[2];

            // read the normal vector from the precalculated normal table
            MD2::LookupNormalIndex(pcVertices[iIndex].normalIndex,pcMesh->mNormals[iCurrent]);
            //pcMesh->mNormals[iCurrent].y *= -1.0f;

            // read texture coordinates
            float s = (float)pcTexCoords[iIndex].s;
            float t = (float)pcTexCoords[iIndex].t;

            // translate texture coordinates
            if (0 == pcTriangles->facesfront && 0 != pcTexCoords[iIndex].onseam)    {
                s += pcHeader->skinwidth * 0.5f;
            }

            // Scale s and t to range from 0.0 to 1.0
            pcMesh->mTextureCoords[0][iCurrent].x = (s + 0.5f) / pcHeader->skinwidth;
            pcMesh->mTextureCoords[0][iCurrent].y = 1.0f-(t + 0.5f) / pcHeader->skinheight;

        }
        pcMesh->mFaces[i].mIndices[0] = iTemp+2;
        pcMesh->mFaces[i].mIndices[1] = iTemp+1;
        pcMesh->mFaces[i].mIndices[2] = iTemp+0;
        pcTriangles++;
    }
    return;
}